

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Little_Hexy.cpp
# Opt level: O0

void __thiscall
chrono::copter::Little_Hexy::AddCollisionShapes
          (Little_Hexy *this,shared_ptr<chrono::ChMaterialSurface> *material)

{
  double dVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<chrono::collision::ChCollisionModel> local_150;
  ChVector<double> local_140;
  shared_ptr<chrono::ChMaterialSurface> local_128;
  shared_ptr<chrono::collision::ChCollisionModel> local_118;
  undefined1 local_108 [8];
  ChMatrix33<double> matr;
  double radius;
  ChVector<double> local_70;
  shared_ptr<chrono::ChMaterialSurface> local_58;
  shared_ptr<chrono::collision::ChCollisionModel> local_48 [2];
  shared_ptr<chrono::collision::ChCollisionModel> local_28;
  shared_ptr<chrono::ChMaterialSurface> *local_18;
  shared_ptr<chrono::ChMaterialSurface> *material_local;
  Little_Hexy *this_local;
  
  local_18 = material;
  material_local = (shared_ptr<chrono::ChMaterialSurface> *)this;
  std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_Copter<6>).chassis);
  ChBody::GetCollisionModel((ChBody *)&local_28);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_28);
  (**(code **)(*(long *)peVar2 + 0x18))();
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_28);
  std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_Copter<6>).chassis);
  ChBody::GetCollisionModel((ChBody *)local_48);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_58,material);
  ChVector<double>::ChVector(&local_70);
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&radius,1.0);
  (**(code **)(*(long *)peVar2 + 0x38))
            (0x3fd1db22d0e56042,0x3fd1db22d0e56042,0x3fdd70a3d70a3d71,peVar2,&local_58,&local_70,
             &radius);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_58);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(local_48);
  matr.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0979;
  ChMatrix33<double>::ChMatrix33
            ((ChMatrix33<double> *)local_108,(ChQuaternion<double> *)&Q_ROTATE_Y_TO_Z);
  std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_Copter<6>).chassis);
  ChBody::GetCollisionModel((ChBody *)&local_118);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_118);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_128,material);
  dVar1 = matr.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  ChVector<double>::ChVector(&local_140,0.0,0.0,0.2783);
  (**(code **)(*(long *)peVar2 + 0x40))
            (dVar1,dVar1,0x3fb999999999999a,peVar2,&local_128,&local_140,local_108);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_128);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_118);
  std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_Copter<6>).chassis);
  ChBody::GetCollisionModel((ChBody *)&local_150);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_150);
  (**(code **)(*(long *)peVar2 + 0x20))();
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_150);
  peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_Copter<6>).chassis);
  chrono::ChBody::SetCollide(SUB81(peVar3,0));
  return;
}

Assistant:

void Little_Hexy::AddCollisionShapes(std::shared_ptr<ChMaterialSurface> material) {
    chassis->GetCollisionModel()->ClearModel();
    // Legs and body boundary box
    chassis->GetCollisionModel()->AddBox(material, 0.279, 0.279, 0.46);
    // Arms and propellers boundary cylinder
    // propeller arm + propeller radius
    double radius = 0.762 + 0.6718 / 2;
    ChMatrix33<> matr(Q_ROTATE_Y_TO_Z);
    chassis->GetCollisionModel()->AddCylinder(material, radius, radius, 0.1, ChVector<>(0, 0, 0.2783), matr);
    chassis->GetCollisionModel()->BuildModel();
    chassis->SetCollide(true);
}